

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_dec.cc
# Opt level: O0

uint64_t woff2::anon_unknown_0::ComputeOffsetToFirstTable(WOFF2Header *hdr)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  long lVar4;
  reference pTVar5;
  TtcFont *ttc_font;
  const_iterator __end3;
  const_iterator __begin3;
  vector<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
  *__range3;
  uint64_t offset;
  WOFF2Header *hdr_local;
  
  __range3 = (vector<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
              *)((ulong)hdr->num_tables * 0x10 + 0xc);
  if (hdr->header_version != 0) {
    uVar1 = hdr->header_version;
    sVar3 = std::
            vector<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
            ::size(&hdr->ttc_fonts);
    lVar4 = woff2::CollectionHeaderSize(uVar1,(uint)sVar3);
    sVar3 = std::
            vector<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
            ::size(&hdr->ttc_fonts);
    __range3 = (vector<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
                *)(lVar4 + sVar3 * 0xc);
    __end3 = std::
             vector<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
             ::begin(&hdr->ttc_fonts);
    ttc_font = (TtcFont *)
               std::
               vector<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
               ::end(&hdr->ttc_fonts);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_woff2::(anonymous_namespace)::TtcFont_*,_std::vector<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>_>
                                       *)&ttc_font), bVar2) {
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_woff2::(anonymous_namespace)::TtcFont_*,_std::vector<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>_>
               ::operator*(&__end3);
      sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        (&pTVar5->table_indices);
      __range3 = (vector<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
                  *)(&(__range3->
                      super__Vector_base<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
                      )._M_impl.super__Vector_impl_data._M_start + sVar3 * 2);
      __gnu_cxx::
      __normal_iterator<const_woff2::(anonymous_namespace)::TtcFont_*,_std::vector<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>_>
      ::operator++(&__end3);
    }
  }
  return (uint64_t)__range3;
}

Assistant:

uint64_t ComputeOffsetToFirstTable(const WOFF2Header& hdr) {
  uint64_t offset = kSfntHeaderSize +
    kSfntEntrySize * static_cast<uint64_t>(hdr.num_tables);
  if (hdr.header_version) {
    offset = CollectionHeaderSize(hdr.header_version, hdr.ttc_fonts.size())
      + kSfntHeaderSize * hdr.ttc_fonts.size();
    for (const auto& ttc_font : hdr.ttc_fonts) {
      offset += kSfntEntrySize * ttc_font.table_indices.size();
    }
  }
  return offset;
}